

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  pointer ppVar1;
  pair<const_int,_int> pVar2;
  pointer *__ptr;
  int i;
  int iVar3;
  float grow;
  float fVar4;
  size_t bucket_count;
  AssertionResult gtest_ar;
  float shrink_threshold;
  TypeParam ht;
  pair<const_int,_int> local_108;
  int local_100;
  float local_fc;
  pair<const_int,_int> local_f8;
  int local_f0;
  AssertHelper local_e8;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_e0;
  float local_b4;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_b0;
  
  local_fc = 0.2;
  do {
    local_f8.first = 0;
    local_f8.second = 0;
    local_f0 = 0;
    local_108.first = 0;
    local_108.second = 0;
    local_100 = 0;
    local_e0.first.super_iterator.ht._0_4_ = 0;
    local_e0.first.super_iterator.pos = (pointer)0x0;
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&local_b0,0,(hasher *)&local_f8,(key_equal *)&local_108,
               (allocator_type *)&local_e0);
    pVar2 = UniqueObjectHelper<std::pair<int_const,int>>(1);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(&local_b0.ht_.rep);
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    use_deleted_ = true;
    local_b0.ht_.rep.key_info.delkey = pVar2.first;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_factor_ = local_fc * 0.5;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    enlarge_factor_ = local_fc;
    fVar4 = local_fc * (float)local_b0.ht_.rep.num_buckets;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (size_type)fVar4;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ =
         (long)(fVar4 - 9.223372e+18) &
         (long)local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               enlarge_threshold_ >> 0x3f |
         local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
         enlarge_threshold_;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    if (0.0 <= local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_factor_) {
      local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
      shrink_factor_ = 0.0;
    }
    fVar4 = local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
            shrink_factor_ * (float)local_b0.ht_.rep.num_buckets;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ = (size_type)fVar4;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(fVar4 - 9.223372e+18) &
         (long)local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_f8.first = (int)local_fc;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e0,"grow_threshold","ht.max_load_factor()",&local_fc,
               (float *)&local_f8);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_f8);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,(char *)pVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_f8 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    local_f8 = (pair<const_int,_int>)0x0;
    local_108.first =
         (int)local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
              shrink_factor_;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e0,"0.0","ht.min_load_factor()",(double *)&local_f8,
               (float *)&local_108);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_f8);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,(char *)pVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_f8 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&local_b0.ht_.rep,0x4098);
    local_f8.first = (undefined4)local_b0.ht_.rep.num_buckets;
    local_f8.second = local_b0.ht_.rep.num_buckets._4_4_;
    local_108 = UniqueObjectHelper<std::pair<int_const,int>>(2);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_e0,&local_b0,&local_108);
    pVar2 = UniqueObjectHelper<std::pair<int_const,int>>(2);
    local_e0.first.super_iterator.ht._0_4_ = pVar2.first;
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&local_b0.ht_.rep,(key_type *)&local_e0);
    iVar3 = 2;
    while( true ) {
      local_108 = UniqueObjectHelper<std::pair<int_const,int>>(iVar3);
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(&local_e0,&local_b0,&local_108);
      if (local_fc <=
          (float)(local_b0.ht_.rep.num_elements - local_b0.ht_.rep.num_deleted) /
          (float)(ulong)local_f8) break;
      local_108.first = (undefined4)local_b0.ht_.rep.num_buckets;
      local_108.second = local_b0.ht_.rep.num_buckets._4_4_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e0,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f8
                 ,(unsigned_long *)&local_108);
      if ((char)local_e0.first.super_iterator.ht == '\0') {
        testing::Message::Message((Message *)&local_108);
        pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        if (local_e0.first.super_iterator.pos != (pointer)0x0) {
          pVar2 = *local_e0.first.super_iterator.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        if (local_108 != (pair<const_int,_int>)0x0) {
          (**(code **)(*(long *)local_108 + 8))();
        }
      }
      ppVar1 = local_e0.first.super_iterator.pos;
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        if (*local_e0.first.super_iterator.pos !=
            (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
          operator_delete((void *)*local_e0.first.super_iterator.pos);
        }
        operator_delete(ppVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_108.first = (undefined4)local_b0.ht_.rep.num_buckets;
    local_108.second = local_b0.ht_.rep.num_buckets._4_4_;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_108,
               (unsigned_long *)&local_f8);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if (local_108 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    fVar4 = (float)local_b0.ht_.rep.num_buckets;
    local_b4 = (float)(local_b0.ht_.rep.num_elements - local_b0.ht_.rep.num_deleted) / fVar4 + -0.01
    ;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_factor_ = 0.5;
    if (local_b4 <= 0.5) {
      local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
      shrink_factor_ = local_b4;
    }
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    enlarge_factor_ = 1.0;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (size_type)
         (local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          shrink_factor_ * fVar4);
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>
                .shrink_factor_ * fVar4 - 9.223372e+18) &
         (long)local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    local_108.first = 0;
    local_108.second = 0x3ff00000;
    local_e8.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e0,"1.0","ht.max_load_factor()",(double *)&local_108,
               (float *)&local_e8);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if (local_108 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    local_108.first =
         (int)local_b0.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
              shrink_factor_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e0,"shrink_threshold","ht.min_load_factor()",&local_b4,
               (float *)&local_108);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if (local_108 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    local_f8.first = (undefined4)local_b0.ht_.rep.num_buckets;
    local_f8.second = local_b0.ht_.rep.num_buckets._4_4_;
    iVar3 = 2;
    while( true ) {
      pVar2 = UniqueObjectHelper<std::pair<int_const,int>>(iVar3);
      local_e0.first.super_iterator.ht._0_4_ = pVar2.first;
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_b0.ht_.rep,(key_type *)&local_e0);
      iVar3 = iVar3 + 1;
      pVar2 = UniqueObjectHelper<std::pair<int_const,int>>(iVar3);
      local_e0.first.super_iterator.ht._0_4_ = pVar2.first;
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&local_b0.ht_.rep,(key_type *)&local_e0);
      local_108 = UniqueObjectHelper<std::pair<int_const,int>>(iVar3);
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(&local_e0,&local_b0,&local_108);
      if ((float)(local_b0.ht_.rep.num_elements - local_b0.ht_.rep.num_deleted) /
          (float)(ulong)local_f8 <= local_b4) break;
      local_108.first = (undefined4)local_b0.ht_.rep.num_buckets;
      local_108.second = local_b0.ht_.rep.num_buckets._4_4_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e0,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f8
                 ,(unsigned_long *)&local_108);
      if ((char)local_e0.first.super_iterator.ht == '\0') {
        testing::Message::Message((Message *)&local_108);
        pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        if (local_e0.first.super_iterator.pos != (pointer)0x0) {
          pVar2 = *local_e0.first.super_iterator.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        if (local_108 != (pair<const_int,_int>)0x0) {
          (**(code **)(*(long *)local_108 + 8))();
        }
      }
      ppVar1 = local_e0.first.super_iterator.pos;
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        if (*local_e0.first.super_iterator.pos !=
            (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
          operator_delete((void *)*local_e0.first.super_iterator.pos);
        }
        operator_delete(ppVar1);
      }
    }
    local_108.first = (undefined4)local_b0.ht_.rep.num_buckets;
    local_108.second = local_b0.ht_.rep.num_buckets._4_4_;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_108,
               (unsigned_long *)&local_f8);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pVar2 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar2 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if (local_108 != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    local_b0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c233e8;
    if (local_b0.ht_.rep.table != (pointer)0x0) {
      free(local_b0.ht_.rep.table);
    }
    local_fc = local_fc + 0.2;
  } while (local_fc <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}